

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.cpp
# Opt level: O0

bool __thiscall irr::CIrrDeviceSDL::setWindowIcon(CIrrDeviceSDL *this,IImage *img)

{
  uint uVar1;
  uint uVar2;
  dimension2d<unsigned_int> *pdVar3;
  long lVar4;
  IImage *in_RSI;
  long in_RDI;
  double __x;
  double __x_00;
  bool succ;
  SDL_Surface *surface;
  u32 width;
  u32 height;
  bool local_1;
  
  if (*(long *)(in_RDI + 0xf8) == 0) {
    local_1 = false;
  }
  else {
    pdVar3 = video::IImage::getDimension(in_RSI);
    uVar2 = pdVar3->Height;
    pdVar3 = video::IImage::getDimension(in_RSI);
    uVar1 = pdVar3->Width;
    lVar4 = SDL_CreateRGBSurface(0,uVar1,uVar2,0x20,0xff0000,0xff00,0xff,0xff000000);
    if (lVar4 == 0) {
      os::Printer::log((Printer *)"Failed to create SDL suface",__x);
      local_1 = false;
    }
    else {
      SDL_LockSurface(lVar4);
      uVar2 = (*in_RSI->_vptr_IImage[4])
                        (in_RSI,*(undefined8 *)(lVar4 + 0x20),(ulong)uVar1,(ulong)uVar2,3,
                         (ulong)*(uint *)(lVar4 + 0x18));
      __x_00 = (double)SDL_UnlockSurface(lVar4);
      if ((uVar2 & 1) == 0) {
        os::Printer::log((Printer *)"Could not copy icon image. Is the format not ECF_A8R8G8B8?",
                         __x_00);
        SDL_FreeSurface(lVar4);
        local_1 = false;
      }
      else {
        SDL_SetWindowIcon(*(undefined8 *)(in_RDI + 0xf8),lVar4);
        SDL_FreeSurface(lVar4);
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool CIrrDeviceSDL::setWindowIcon(const video::IImage *img)
{
	if (!Window)
		return false;

	u32 height = img->getDimension().Height;
	u32 width = img->getDimension().Width;

	SDL_Surface *surface = SDL_CreateRGBSurface(0, width, height, 32,
			0x00ff0000, 0x0000ff00, 0x000000ff, 0xff000000);

	if (!surface) {
		os::Printer::log("Failed to create SDL suface", ELL_ERROR);
		return false;
	}

	SDL_LockSurface(surface);
	bool succ = img->copyToNoScaling(surface->pixels, width, height, video::ECF_A8R8G8B8, surface->pitch);
	SDL_UnlockSurface(surface);

	if (!succ) {
		os::Printer::log("Could not copy icon image. Is the format not ECF_A8R8G8B8?", ELL_ERROR);
		SDL_FreeSurface(surface);
		return false;
	}

	SDL_SetWindowIcon(Window, surface);

	SDL_FreeSurface(surface);

	return true;
}